

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osqp.c
# Opt level: O0

c_int osqp_update_polish_refine_iter(OSQPWorkspace *work,c_int polish_refine_iter_new)

{
  char *in_RSI;
  long in_RDI;
  c_int local_8;
  
  if (in_RDI == 0) {
    local_8 = _osqp_error(0,in_RSI);
  }
  else if ((long)in_RSI < 0) {
    printf("ERROR in %s: ","osqp_update_polish_refine_iter");
    printf("polish_refine_iter must be nonnegative");
    printf("\n");
    local_8 = 1;
  }
  else {
    *(char **)(*(long *)(in_RDI + 0xb8) + 0x80) = in_RSI;
    local_8 = 0;
  }
  return local_8;
}

Assistant:

c_int osqp_update_polish_refine_iter(OSQPWorkspace *work, c_int polish_refine_iter_new) {

  // Check if workspace has been initialized
  if (!work) return osqp_error(OSQP_WORKSPACE_NOT_INIT_ERROR);

  // Check that polish_refine_iter is nonnegative
  if (polish_refine_iter_new < 0) {
# ifdef PRINTING
    c_eprint("polish_refine_iter must be nonnegative");
# endif /* ifdef PRINTING */
    return 1;
  }

  // Update polish_refine_iter
  work->settings->polish_refine_iter = polish_refine_iter_new;

  return 0;
}